

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

size_t Curl_multissl_version(char *buffer,size_t size)

{
  long lVar1;
  Curl_ssl *pCVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  
  pCVar2 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar2 = available_backends[0];
  }
  if (pCVar2 != Curl_multissl_version::selected) {
    pcVar3 = Curl_multissl_version::backends;
    Curl_multissl_version::selected = pCVar2;
    if (available_backends[0] != (Curl_ssl *)0x0) {
      lVar5 = 0;
      pcVar3 = Curl_multissl_version::backends;
      do {
        if (lVar5 != 0) {
          *pcVar3 = ' ';
          pcVar3 = pcVar3 + 1;
        }
        if (Curl_multissl_version::selected != available_backends[lVar5]) {
          *pcVar3 = '(';
          pcVar3 = pcVar3 + 1;
        }
        sVar4 = (*available_backends[lVar5]->version)
                          (pcVar3,(long)&Curl_multissl_version::total - (long)pcVar3);
        pcVar3 = pcVar3 + sVar4;
        if (Curl_multissl_version::selected != available_backends[lVar5]) {
          *pcVar3 = ')';
          pcVar3 = pcVar3 + 1;
        }
        lVar1 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (available_backends[lVar1] != (Curl_ssl *)0x0);
    }
    *pcVar3 = '\0';
    Curl_multissl_version::total = (size_t)(pcVar3 + -0x16ad90);
  }
  sVar4 = Curl_multissl_version::total;
  if (size < Curl_multissl_version::total) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  return sVar4;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    int i;

    selected = current;

    for(i = 0; available_backends[i]; i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, backends + sizeof(backends) - p);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size < total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return total;
}